

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O0

vector __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::grad
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,vector *p)

{
  bool bVar1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  Index IVar2;
  vector vVar3;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_b0;
  Matrix<double,__1,_1,_0,__1,_1> local_a0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_90;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_70;
  Matrix<double,__1,_1,_0,__1,_1> local_60 [2];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_20;
  vector *p_local;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this_local;
  
  local_20 = in_RDX;
  p_local = p;
  this_local = this;
  if (((p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows & 1) ==
       0) || (bVar1 = tp_linear::has_derivative(), !bVar1)) {
    if ((p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
        0x100) == 0) {
      local_90 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,local_20);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_80,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_90);
      tp_linear::grad_convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                ((tp_linear *)this,(vector *)&local_80,
                 (cartesian_cubic<float> *)
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,(cartesian_cubic<float> **)(p + 1));
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
      IVar2 = extraout_RDX_01;
    }
    else {
      local_b0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,local_20);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_a0,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_b0);
      tp_linear::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                ((tp_linear *)this,(vector *)&local_a0,
                 (cartesian_cubic<float> *)
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,(cartesian_cubic<float> **)(p + 1),(double *)(p + 3));
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a0);
      IVar2 = extraout_RDX_02;
    }
  }
  else if ((p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
           0x100) == 0) {
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                          &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows,local_20);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_30,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_40);
    tp_linear::grad_convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
              ((tp_linear *)this,(vector *)&local_30,
               (cartesian_cubic<float> *)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
    IVar2 = extraout_RDX;
  }
  else {
    local_70 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                          &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows,local_20);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_60,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_70);
    tp_linear::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
              ((tp_linear *)this,(vector *)local_60,
               (cartesian_cubic<float> *)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               (double *)(p + 3));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_60);
    IVar2 = extraout_RDX_00;
  }
  vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const vector grad(const vector &p) const {
            if(_bUseBasisDerivative && BF::has_derivative()) {
                if(!_bForceScale)
                    return BF::template grad_convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice);
                return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        _dBasisScale);

            }
            if(!_bForceScale)
                return BF::template grad_convolution_sum<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d);
            return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d,
                        _dBasisScale);

        }